

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O3

void __thiscall ItemWrapper::ItemWrapper(ItemWrapper *this,Item *item,itemLocation l)

{
  pointer pcVar1;
  string item_00;
  _Alloc_hider in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0 [24];
  
  (this->classItem).name._M_dataplus._M_p = (pointer)&(this->classItem).name.field_2;
  pcVar1 = (item->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (item->name)._M_string_length);
  (this->classItem).item = item->item;
  this->location = l;
  Action::Action(&this->defaultAction,NO_ACTION);
  this->state = DEFAULT;
  (this->itemName)._M_dataplus._M_p = (pointer)&(this->itemName).field_2;
  (this->itemName)._M_string_length = 0;
  (this->itemName).field_2._M_local_buf[0] = '\0';
  Item::getName_abi_cxx11_((string *)&stack0xffffffffffffffb8,item);
  item_00._M_string_length = in_stack_ffffffffffffffc0._0_8_;
  item_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffffc0._8_16_;
  item_00._M_dataplus._M_p = in_stack_ffffffffffffffb8._M_p;
  setItemName(this,item_00);
  if (in_stack_ffffffffffffffb8._M_p != &stack0xffffffffffffffc8) {
    operator_delete(in_stack_ffffffffffffffb8._M_p);
  }
  return;
}

Assistant:

ItemWrapper::ItemWrapper(Item item, itemLocation l) : classItem(item), location(l),
defaultAction(Action(NO_ACTION)), state(DEFAULT){
    setItemName(item.getName());
}